

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

mcu8str * mcplcfg_shlibpath(mcu8str *__return_storage_ptr__,nccfgstate *state)

{
  mcu8str shlibdir;
  mcu8str local_30;
  
  if ((state->shlibdir_override).size == 0) {
    mcplcfg_init_bindir(state);
    mcplcfg_resolverelpath(&local_30,&state->bindir,"../lib");
    mcplcfg_shlibpath_given_shlibdir(__return_storage_ptr__,&local_30);
    mcu8str_dealloc(&local_30);
  }
  else {
    mcplcfg_shlibpath_given_shlibdir(__return_storage_ptr__,&state->shlibdir_override);
  }
  return __return_storage_ptr__;
}

Assistant:

mcu8str mcplcfg_shlibpath( nccfgstate* state )
{
  if ( state->shlibdir_override.size > 0 ) {
    return mcplcfg_shlibpath_given_shlibdir( &(state->shlibdir_override) );
  } else {
    mcplcfg_init_bindir(state);
    mcu8str shlibdir = mcplcfg_resolverelpath(&(state->bindir),
                                            mcplcfg_const_bin2shlibdir());
    mcu8str res = mcplcfg_shlibpath_given_shlibdir( &shlibdir );
    mcu8str_dealloc( &shlibdir );
    return res;
  }
}